

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::MergeReturnPass::AddSingleCaseSwitchAroundFunction(MergeReturnPass *this)

{
  bool bVar1;
  IRContext *this_00;
  CFG *this_01;
  MergeReturnPass *this_local;
  
  CreateReturnBlock(this);
  CreateReturn(this,this->final_return_block_);
  this_00 = Pass::context((Pass *)this);
  bVar1 = IRContext::AreAnalysesValid(this_00,kAnalysisCFG);
  if (bVar1) {
    this_01 = Pass::cfg((Pass *)this);
    CFG::RegisterBlock(this_01,this->final_return_block_);
  }
  bVar1 = CreateSingleCaseSwitch(this,this->final_return_block_);
  return bVar1;
}

Assistant:

bool MergeReturnPass::AddSingleCaseSwitchAroundFunction() {
  CreateReturnBlock();
  CreateReturn(final_return_block_);

  if (context()->AreAnalysesValid(IRContext::kAnalysisCFG)) {
    cfg()->RegisterBlock(final_return_block_);
  }

  if (!CreateSingleCaseSwitch(final_return_block_)) {
    return false;
  }
  return true;
}